

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetPSTATPortStatus(ndicapi *pol,int port)

{
  unsigned_long uVar1;
  char (*local_28) [32];
  char *dp;
  int port_local;
  ndicapi *pol_local;
  
  if ((port < 0x31) || (0x33 < port)) {
    if ((port < 0x41) || (0x49 < port)) {
      return 0;
    }
    local_28 = pol->PstatPassiveBasic + (port + -0x41);
  }
  else {
    local_28 = pol->PstatBasic + (port + -0x31);
  }
  if (((*local_28)[0] == 'U') || ((*local_28)[0] == '\0')) {
    pol_local._4_4_ = 0;
  }
  else {
    uVar1 = ndiHexToUnsignedLong(*local_28 + 0x1e,2);
    pol_local._4_4_ = (int)uVar1;
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetPSTATPortStatus(ndicapi* pol, int port)
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->PstatBasic[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->PstatPassiveBasic[port - 'A'];
  }
  else
  {
    return 0;
  }

  // the 'U' is for UNOCCUPIED
  if (*dp == 'U' || *dp == '\0')
  {
    return 0;
  }

  // skip to the last two characters
  dp += 30;

  return (int)ndiHexToUnsignedLong(dp, 2);
}